

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * el::base::utils::OS::getEnvironmentVariable_abi_cxx11_
                   (char *variableName,char *defaultVal,char *alternativeBashCommand)

{
  char *pcVar1;
  int iVar2;
  char *in_RDX;
  char *in_RSI;
  string *in_RDI;
  char *val;
  allocator local_3d [20];
  allocator local_29;
  char *local_28;
  char *local_18;
  
  local_18 = in_RDX;
  local_28 = getenv(in_RSI);
  if ((local_28 != (char *)0x0) && (iVar2 = strcmp(local_28,""), pcVar1 = local_28, iVar2 != 0)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,pcVar1,local_3d);
    ::std::allocator<char>::~allocator((allocator<char> *)local_3d);
    return in_RDI;
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)in_RDI,local_18,&local_29);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return in_RDI;
}

Assistant:

std::string OS::getEnvironmentVariable(const char* variableName, const char* defaultVal,
                                       const char* alternativeBashCommand) {
#if ELPP_OS_UNIX
  const char* val = getenv(variableName);
#elif ELPP_OS_WINDOWS
  const char* val = getWindowsEnvironmentVariable(variableName);
#endif  // ELPP_OS_UNIX
  if ((val == nullptr) || ((strcmp(val, "") == 0))) {
#if ELPP_OS_UNIX && defined(ELPP_FORCE_ENV_VAR_FROM_BASH)
    // Try harder on unix-based systems
    std::string valBash = base::utils::OS::getBashOutput(alternativeBashCommand);
    if (valBash.empty()) {
      return std::string(defaultVal);
    } else {
      return valBash;
    }
#elif ELPP_OS_WINDOWS || ELPP_OS_UNIX
    ELPP_UNUSED(alternativeBashCommand);
    return std::string(defaultVal);
#endif  // ELPP_OS_UNIX && defined(ELPP_FORCE_ENV_VAR_FROM_BASH)
  }
  return std::string(val);
}